

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O1

work_t __thiscall
gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear
          (Image<float,_gimage::PixelTraits<float>_> *this,float x,float y,int j)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  
  iVar6 = 0;
  if (0 < j) {
    iVar6 = j;
  }
  iVar5 = this->depth + -1;
  if (iVar6 < iVar5) {
    iVar5 = iVar6;
  }
  fVar3 = 0.0;
  if (0.0 <= x + -0.5) {
    fVar3 = x + -0.5;
  }
  fVar4 = 0.0;
  if (0.0 <= y + -0.5) {
    fVar4 = y + -0.5;
  }
  uVar9 = -(uint)(fVar3 < (float)(this->width + -1));
  fVar11 = (float)(~uVar9 & (uint)((float)this->width + -1.001) | (uint)fVar3 & uVar9);
  uVar9 = -(uint)(fVar4 < (float)(this->height + -1));
  fVar10 = (float)(~uVar9 & (uint)((float)this->height + -1.001) | (uint)fVar4 & uVar9);
  lVar7 = (long)fVar11;
  lVar8 = (long)fVar10;
  pfVar2 = this->img[iVar5][lVar8 + 1];
  pfVar1 = this->img[iVar5][lVar8] + lVar7;
  fVar3 = *pfVar1;
  fVar4 = pfVar1[1];
  auVar12._0_4_ = -(uint)(0x7f7fffff < (uint)ABS(fVar3));
  auVar12._4_4_ = -(uint)(0x7f7fffff < (uint)ABS(fVar4));
  auVar12._8_4_ = -(uint)(0x7f7fffff < (uint)ABS(pfVar2[lVar7 + 2]));
  auVar12._12_4_ = -(uint)(0x7f7fffff < (uint)ABS(pfVar2[lVar7 + 3]));
  iVar6 = movmskps((int)pfVar2,auVar12);
  if (iVar6 != 0) {
    return INFINITY;
  }
  fVar11 = (fVar11 - (float)lVar7) * 4.0;
  fVar10 = (fVar10 - (float)lVar8) * 4.0;
  return (pfVar2[lVar7 + 3] * fVar11 * fVar10 +
         (4.0 - fVar11) * pfVar2[lVar7 + 2] * fVar10 +
         (4.0 - fVar10) * fVar3 * (4.0 - fVar11) + fVar4 * fVar11 * (4.0 - fVar10)) * 0.0625;
}

Assistant:

work_t getBilinear(float x, float y, int j=0) const
    {
      long    i, k;
      store_t p0, p1, p2, p3;
      work_t  ret=ptraits::invalid();

      j=std::max(0, j);
      j=std::min(depth-1, j);

      x-=0.5f;
      y-=0.5f;

      if (x < 0)
      {
        x=0;
      }

      if (y < 0)
      {
        y=0;
      }

      if (x >= width-1)
      {
        x=width-1.001f;
      }

      if (y >= height-1)
      {
        y=height-1.001f;
      }

      i=static_cast<long>(x);
      k=static_cast<long>(y);

      x-=i;
      y-=k;

      p0=img[j][k][i];
      p1=img[j][k][i+1];
      p2=img[j][k+1][i];
      p3=img[j][k+1][i+1];

      if (isValidS(p0) && isValidS(p1) && isValidS(p2) && isValidS(p3))
      {
        x*=4;
        y*=4;

        ret=static_cast<work_t>(p0*(4-x)*(4-y)+p1*x*(4-y)+p2*(4-x)*y+p3*x*y);
        ret/=16;
      }

      return ret;
    }